

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O0

void __thiscall layer::Convolution2D::conf(Convolution2D *this,int sizeXIn,int sizeYIn,int sizeZIn)

{
  int local_34;
  int local_2c;
  int sizeZIn_local;
  int sizeYIn_local;
  int sizeXIn_local;
  Convolution2D *this_local;
  
  this->_sizeXIn = sizeXIn;
  this->_sizeYIn = sizeYIn;
  (this->super_Layer)._sizeZWeight = sizeZIn;
  if (((this->super_Layer)._sizeXWeight & 1U) == 0) {
    local_2c = (this->super_Layer)._sizeXWeight >> 1;
  }
  else {
    local_2c = ((this->super_Layer)._sizeXWeight >> 1) + 1;
  }
  (this->super_Layer)._sizeXOut = ((sizeXIn + this->_zeroPaddingX * 2) - local_2c) / this->_stepX;
  if (((this->super_Layer)._sizeYWeight & 1U) == 0) {
    local_34 = (this->super_Layer)._sizeYWeight >> 1;
  }
  else {
    local_34 = ((this->super_Layer)._sizeYWeight >> 1) + 1;
  }
  (this->super_Layer)._sizeYOut = ((sizeYIn + this->_zeroPaddingY * 2) - local_34) / this->_stepY;
  return;
}

Assistant:

void Convolution2D::conf(int sizeXIn, int sizeYIn, int sizeZIn)
    {
        _sizeXIn = sizeXIn;
        _sizeYIn = sizeYIn;

        _sizeZWeight = sizeZIn;

        _sizeXOut = (sizeXIn + (_zeroPaddingX<<1) - (_sizeXWeight&1 ? (_sizeXWeight>>1)+1 : _sizeXWeight>>1)) / _stepX;
        _sizeYOut = (sizeYIn + (_zeroPaddingY<<1) - (_sizeYWeight&1 ? (_sizeYWeight>>1)+1 : _sizeYWeight>>1)) / _stepY;
    }